

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O0

uint32_t cfd::core::CalculateRangeProofSize(int64_t amount,int exponent,int minimum_bits)

{
  allocator<unsigned_char> *this;
  uint32_t uVar1;
  size_t sVar2;
  CfdSourceLocation local_210;
  ByteData local_1f8;
  uint32_t local_1dc;
  undefined1 local_1d8 [4];
  uint32_t rangeproof_size;
  ByteData local_1a0;
  int64_t local_188;
  uint64_t value;
  vector<unsigned_char,_std::allocator<unsigned_char>_> range_proof;
  vector<unsigned_char,_std::allocator<unsigned_char>_> commitment;
  Privkey privkey;
  vector<unsigned_char,_std::allocator<unsigned_char>_> vbf;
  undefined1 local_110 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> empty_factor;
  string local_f0;
  undefined1 local_d0 [8];
  ConfidentialAssetId asset;
  string local_a0;
  undefined1 local_80 [8];
  ByteData256 key_data;
  allocator local_51;
  string local_50;
  undefined1 local_30 [8];
  ByteData vbf_data;
  int minimum_bits_local;
  int exponent_local;
  int64_t amount_local;
  
  vbf_data.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_4_ = minimum_bits;
  vbf_data.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = exponent;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string
            ((string *)&local_50,"e863b2791be1be9659a940123143f210b9760a3b85862bf0833ef27c80c83816",
             &local_51);
  ByteData::ByteData((ByteData *)local_30,&local_50);
  ::std::__cxx11::string::~string((string *)&local_50);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_51);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string
            ((string *)&local_a0,"7df80e5705518368f2e1598e177f4929ba5ab54ab8177582dcc7504fc333c84e",
             (allocator *)&asset.field_0x27);
  ByteData256::ByteData256((ByteData256 *)local_80,&local_a0);
  ::std::__cxx11::string::~string((string *)&local_a0);
  ::std::allocator<char>::~allocator((allocator<char> *)&asset.field_0x27);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string
            ((string *)&local_f0,"3668f9bdc8f1cc9c1a0247613fffa17b18e3141898e011386b831709c518d805",
             (allocator *)
             ((long)&empty_factor.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  ConfidentialAssetId::ConfidentialAssetId((ConfidentialAssetId *)local_d0,&local_f0);
  ::std::__cxx11::string::~string((string *)&local_f0);
  ::std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&empty_factor.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  this = (allocator<unsigned_char> *)
         ((long)&vbf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage + 7);
  ::std::allocator<unsigned_char>::allocator(this);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_110,0x20,this);
  ::std::allocator<unsigned_char>::~allocator
            ((allocator<unsigned_char> *)
             ((long)&vbf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     &privkey.is_compressed_,(ByteData *)local_30);
  Privkey::Privkey((Privkey *)
                   &commitment.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage,(ByteData256 *)local_80,
                   kMainnet,true);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             &range_proof.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&value);
  local_188 = amount;
  Script::Script((Script *)local_1d8);
  CalculateRangeProof(&local_1a0,amount,(Pubkey *)0x0,
                      (Privkey *)
                      &commitment.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage,
                      (ConfidentialAssetId *)local_d0,
                      (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_110,
                      (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                      &privkey.is_compressed_,(Script *)local_1d8,1,
                      vbf_data.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage._4_4_,
                      (int)vbf_data.data_.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_end_of_storage,
                      (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                      &range_proof.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,
                      (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&value);
  ByteData::~ByteData(&local_1a0);
  Script::~Script((Script *)local_1d8);
  ByteData::ByteData(&local_1f8,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)&value);
  sVar2 = ByteData::GetSerializeSize(&local_1f8);
  ByteData::~ByteData(&local_1f8);
  local_1dc = (uint32_t)sVar2;
  local_210.filename =
       strrchr("//workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/src/cfdcore_elements_transaction.cpp"
               ,0x2f);
  local_210.filename = local_210.filename + 1;
  local_210.line = 0xe2;
  local_210.funcname = "CalculateRangeProofSize";
  logger::info<int&,int&,unsigned_int&>
            (&local_210,"[{},{}] rangeproof_size[{}]",
             (int *)((long)&vbf_data.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage + 4),
             (int *)&vbf_data.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage,&local_1dc);
  uVar1 = local_1dc;
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&value);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             &range_proof.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  Privkey::~Privkey((Privkey *)
                    &commitment.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&privkey.is_compressed_);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_110);
  ConfidentialAssetId::~ConfidentialAssetId((ConfidentialAssetId *)local_d0);
  ByteData256::~ByteData256((ByteData256 *)local_80);
  ByteData::~ByteData((ByteData *)local_30);
  return uVar1;
}

Assistant:

static uint32_t CalculateRangeProofSize(
    int64_t amount, int exponent, int minimum_bits) {
  // dummy value
  ByteData vbf_data(
      "e863b2791be1be9659a940123143f210b9760a3b85862bf0833ef27c80c83816");
  ByteData256 key_data(
      "7df80e5705518368f2e1598e177f4929ba5ab54ab8177582dcc7504fc333c84e");
  ConfidentialAssetId asset(
      "3668f9bdc8f1cc9c1a0247613fffa17b18e3141898e011386b831709c518d805");
  std::vector<uint8_t> empty_factor(kBlindFactorSize);
  std::vector<uint8_t> vbf = vbf_data.GetBytes();
  Privkey privkey(key_data);
  std::vector<uint8_t> commitment;
  std::vector<uint8_t> range_proof;
  uint64_t value = static_cast<uint64_t>(amount);
  CalculateRangeProof(
      value, nullptr, privkey, asset, empty_factor, vbf, Script(), 1, exponent,
      minimum_bits, &commitment, &range_proof);
  uint32_t rangeproof_size =
      static_cast<uint32_t>(ByteData(range_proof).GetSerializeSize());
  info(
      CFD_LOG_SOURCE, "[{},{}] rangeproof_size[{}]", exponent, minimum_bits,
      rangeproof_size);
  return rangeproof_size;
}